

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
findBucketWithHash<void_const*>
          (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *this,void **key,
          size_t hash)

{
  Span *pSVar1;
  ulong in_RCX;
  ulong uVar2;
  byte bVar3;
  Bucket BVar4;
  
  pSVar1 = (Span *)(key + (((ulong)(this + -1) & in_RCX) >> 7) * 0x12);
  uVar2 = (ulong)((uint)((ulong)(this + -1) & in_RCX) & 0x7f);
  bVar3 = pSVar1->offsets[uVar2];
  if (bVar3 != 0xff) {
    do {
      if (*(size_t *)pSVar1->entries[bVar3].storage.data == hash) break;
      uVar2 = uVar2 + 1;
      if (uVar2 == 0x80) {
        pSVar1 = pSVar1 + 1;
        if (((long)pSVar1 - (long)key >> 4) * -0x71c71c71c71c71c7 - ((ulong)this >> 7) == 0) {
          pSVar1 = (Span *)key;
        }
        uVar2 = 0;
      }
      bVar3 = pSVar1->offsets[uVar2];
    } while (bVar3 != 0xff);
  }
  BVar4.index = uVar2;
  BVar4.span = pSVar1;
  return BVar4;
}

Assistant:

inline constexpr size_t bucketForHash(size_t nBuckets, size_t hash) noexcept
{
    return hash & (nBuckets - 1);
}